

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_checkbox_text(nk_context *ctx,char *text,int len,nk_bool *active)

{
  int iVar1;
  nk_bool nVar2;
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  int old_val;
  nk_bool in_stack_00000018;
  undefined4 local_4;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RCX == (int *)0x0)) {
    local_4 = 0;
  }
  else {
    iVar1 = *in_RCX;
    nVar2 = nk_check_text(ctx,text,len,in_stack_00000018);
    *in_RCX = nVar2;
    local_4 = (uint)(iVar1 != *in_RCX);
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_checkbox_text(struct nk_context *ctx, const char *text, int len, nk_bool *active)
{
int old_val;
NK_ASSERT(ctx);
NK_ASSERT(text);
NK_ASSERT(active);
if (!ctx || !text || !active) return 0;
old_val = *active;
*active = nk_check_text(ctx, text, len, *active);
return old_val != *active;
}